

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

MPP_RET mpp_buffer_detach_dev_f(char *caller,MppBuffer buffer,MppDev dev)

{
  MPP_RET local_3c;
  MppDevBufMapNode *pMStack_38;
  MPP_RET ret;
  MppDevBufMapNode *n;
  MppDevBufMapNode *pos;
  MppBufferImpl *impl;
  MppDev dev_local;
  MppBuffer buffer_local;
  char *caller_local;
  
  local_3c = MPP_OK;
  mpp_dev_ioctl(dev,0xb,(void *)0x0);
  pthread_mutex_lock((pthread_mutex_t *)((long)buffer + 0x28));
  n = *(MppDevBufMapNode **)((long)buffer + 0xd8);
  pMStack_38 = (MppDevBufMapNode *)(n->list_buf).next;
  do {
    if (n == (MppDevBufMapNode *)((long)buffer + 0xd8)) {
LAB_0016da49:
      pthread_mutex_unlock((pthread_mutex_t *)((long)buffer + 0x28));
      mpp_dev_ioctl(dev,0xc,(void *)0x0);
      return local_3c;
    }
    if (n->dev == dev) {
      list_del_init(&n->list_buf);
      local_3c = mpp_dev_ioctl(dev,0xe,n);
      mpp_mem_pool_put_f(caller,mpp_buf_map_node_pool,n);
      goto LAB_0016da49;
    }
    n = pMStack_38;
    pMStack_38 = (MppDevBufMapNode *)(pMStack_38->list_buf).next;
  } while( true );
}

Assistant:

MPP_RET mpp_buffer_detach_dev_f(const char *caller, MppBuffer buffer, MppDev dev)
{
    MppBufferImpl *impl = (MppBufferImpl *)buffer;
    MppDevBufMapNode *pos, *n;
    MPP_RET ret = MPP_OK;

    mpp_dev_ioctl(dev, MPP_DEV_LOCK_MAP, NULL);
    pthread_mutex_lock(&impl->lock);
    list_for_each_entry_safe(pos, n, &impl->list_maps, MppDevBufMapNode, list_buf) {
        if (pos->dev == dev) {
            list_del_init(&pos->list_buf);
            ret = mpp_dev_ioctl(dev, MPP_DEV_DETACH_FD, pos);
            mpp_mem_pool_put_f(caller, mpp_buf_map_node_pool, pos);
            break;
        }
    }
    pthread_mutex_unlock(&impl->lock);
    mpp_dev_ioctl(dev, MPP_DEV_UNLOCK_MAP, NULL);

    return ret;
}